

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_eval.cpp
# Opt level: O0

ON_Plane * __thiscall
ON_SubDFace::ControlNetCenterFrame(ON_Plane *__return_storage_ptr__,ON_SubDFace *this)

{
  bool bVar1;
  undefined1 local_48 [8];
  ON_3dVector N;
  ON_3dPoint C;
  ON_SubDFace *this_local;
  ON_Plane *center_frame;
  
  ControlNetCenterPoint((ON_3dPoint *)&N.z,this);
  ControlNetCenterNormal((ON_3dVector *)local_48,this);
  bVar1 = ON_3dPoint::IsValid((ON_3dPoint *)&N.z);
  if ((bVar1) && (bVar1 = ON_3dVector::IsNotZero((ON_3dVector *)local_48), bVar1)) {
    ON_Plane::ON_Plane(__return_storage_ptr__);
    bVar1 = ON_Plane::CreateFromNormal
                      (__return_storage_ptr__,(ON_3dPoint *)&N.z,(ON_3dVector *)local_48);
    if (bVar1) {
      return __return_storage_ptr__;
    }
    ON_Plane::~ON_Plane(__return_storage_ptr__);
  }
  memcpy(__return_storage_ptr__,&ON_Plane::NanPlane,0x80);
  return __return_storage_ptr__;
}

Assistant:

const ON_Plane ON_SubDFace::ControlNetCenterFrame() const
{
  const ON_3dPoint C = ControlNetCenterPoint();
  const ON_3dVector N = ControlNetCenterNormal();
  if (C.IsValid() && N.IsNotZero())
  {
    // TODO - better choices for x and y axes
    ON_Plane center_frame;
    if (center_frame.CreateFromNormal(C, N))
      return center_frame;
  }
  return ON_Plane::NanPlane;
}